

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.h
# Opt level: O2

void __thiscall
Js::
JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
::Dispose(JsrtSourceHolder<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*),_void_(*)(unsigned_long)>
          *this,bool isShutdown)

{
  DetachedStateBase *this_00;
  
  this_00 = (this->mappedSerializedScriptValue).ptr;
  if (this_00 != (DetachedStateBase *)0x0) {
    DetachedStateBase::CleanUp(this_00);
    return;
  }
  return;
}

Assistant:

virtual void Dispose(bool isShutdown) override
        {
#ifndef NTBUILD
            if (this->mappedSerializedScriptValue != nullptr)
            {
                // We have to extend the buffer data's lifetime until Dispose because
                // it might be used during finalization of other objects, such as
                // FunctionEntryPointInfo which wants to log its name.
                this->mappedSerializedScriptValue->CleanUp();
            }
#endif
        }